

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::AddMapping
          (ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> *this,char *name,
          eCh_shaftsmotor_mode enumid)

{
  ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> mpair;
  ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> CStack_38;
  
  ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::ChEnumNamePair
            (&CStack_38,name,enumid);
  std::
  vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>
  ::push_back((this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void AddMapping(const char* name, Te enumid) {
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }